

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcolui.c
# Opt level: O2

int ffu2fi4(unsigned_short *input,long ntodo,double scale,double zero,int *output,int *status)

{
  long lVar1;
  long lVar2;
  int iVar3;
  double dVar4;
  
  lVar1 = 0;
  if (0 < ntodo) {
    lVar1 = ntodo;
  }
  if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
    for (lVar2 = 0; lVar1 != lVar2; lVar2 = lVar2 + 1) {
      dVar4 = ((double)input[lVar2] - zero) / scale;
      if (-2147483648.49 <= dVar4) {
        if (dVar4 <= 2147483647.49) {
          if (0.0 <= dVar4) {
            dVar4 = dVar4 + 0.5;
          }
          else {
            dVar4 = dVar4 + -0.5;
          }
          iVar3 = (int)dVar4;
        }
        else {
          *status = -0xb;
          iVar3 = 0x7fffffff;
        }
      }
      else {
        *status = -0xb;
        iVar3 = -0x80000000;
      }
      output[lVar2] = iVar3;
    }
  }
  else {
    for (lVar2 = 0; lVar1 != lVar2; lVar2 = lVar2 + 1) {
      output[lVar2] = (uint)input[lVar2];
    }
  }
  return *status;
}

Assistant:

int ffu2fi4(unsigned short *input, /* I - array of values to be converted */
            long ntodo,        /* I - number of elements in the array  */
            double scale,      /* I - FITS TSCALn or BSCALE value      */
            double zero,       /* I - FITS TZEROn or BZERO  value      */
            INT32BIT *output,      /* O - output array of converted values */
            int *status)       /* IO - error status                    */
/*
  Copy input to output prior to writing output to a FITS file.
  Do datatype conversion and scaling if required
*/
{
    long ii;
    double dvalue;

    if (scale == 1. && zero == 0.)
    {       
        for (ii = 0; ii < ntodo; ii++)
            output[ii] = (INT32BIT) input[ii];   /* copy input to output */
    }
    else
    {
        for (ii = 0; ii < ntodo; ii++)
        {
            dvalue = ((double) input[ii] - zero) / scale;

            if (dvalue < DINT_MIN)
            {
                *status = OVERFLOW_ERR;
                output[ii] = INT32_MIN;
            }
            else if (dvalue > DINT_MAX)
            {
                *status = OVERFLOW_ERR;
                output[ii] = INT32_MAX;
            }
            else
            {
                if (dvalue >= 0)
                    output[ii] = (INT32BIT) (dvalue + .5);
                else
                    output[ii] = (INT32BIT) (dvalue - .5);
            }
        }
    }
    return(*status);
}